

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.h
# Opt level: O3

void __thiscall ser::Savepoint::Savepoint(Savepoint *this,Savepoint *other)

{
  _Rb_tree_header *p_Var1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)this);
  MetainfoSet::operator=(&this->metainfo_,&other->metainfo_);
  return;
}

Assistant:

Savepoint(const Savepoint& other)
        {
            *this = other;
        }